

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGI.cpp
# Opt level: O3

CharContent * __thiscall
CGI::make_environment
          (CharContent *__return_storage_ptr__,CGI *this,Request *request,CharContent *cgi_key)

{
  size_t __n;
  bool bVar1;
  char *pcVar2;
  iterator iVar3;
  mapped_type *pmVar4;
  void *pvVar5;
  size_t sVar6;
  size_t sVar7;
  CharContent *cc;
  ulong uVar8;
  CharContent path;
  sockaddr_in local_sock;
  socklen_t local_sock_len;
  socklen_t local_sock_len_1;
  CharContent local_88;
  CharContent local_60;
  socklen_t local_34;
  undefined3 uStack_30;
  socklen_t local_2c;
  
  pcVar2 = (char *)&local_88;
  bVar1 = operator==(cgi_key,"REQUEST_METHOD");
  if (bVar1) {
    __return_storage_ptr__->_vptr_CharContent = (_func_int **)&PTR__CharContent_00117c48;
    __return_storage_ptr__->npos = 0xffffffffffffffff;
    uVar8 = (request->method).m_length;
    pcVar2 = (char *)operator_new__(uVar8);
    __return_storage_ptr__->m = pcVar2;
    __return_storage_ptr__->size = (request->method).size;
    __return_storage_ptr__->m_length = uVar8;
    memset(pcVar2,0,uVar8);
    memmove(pcVar2,(request->method).m,uVar8);
    return __return_storage_ptr__;
  }
  bVar1 = operator==(cgi_key,"CONTENT_TYPE");
  if (bVar1) {
    CharContent::CharContent(&local_88,"Content-Type");
    iVar3 = std::
            _Hashtable<CharContent,_std::pair<const_CharContent,_CharContent>,_std::allocator<std::pair<const_CharContent,_CharContent>_>,_std::__detail::_Select1st,_EqualFunc,_hashFunc,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&(request->headers)._M_h,&local_88);
    if (iVar3.super__Node_iterator_base<std::pair<const_CharContent,_CharContent>,_true>._M_cur ==
        (__node_type *)0x0) {
      CharContent::CharContent(__return_storage_ptr__,"");
    }
    else {
      CharContent::CharContent(&local_60,"Content-Type");
      pmVar4 = std::__detail::
               _Map_base<CharContent,_std::pair<const_CharContent,_CharContent>,_std::allocator<std::pair<const_CharContent,_CharContent>_>,_std::__detail::_Select1st,_EqualFunc,_hashFunc,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<CharContent,_std::pair<const_CharContent,_CharContent>,_std::allocator<std::pair<const_CharContent,_CharContent>_>,_std::__detail::_Select1st,_EqualFunc,_hashFunc,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&request->headers,&local_60);
      __return_storage_ptr__->_vptr_CharContent = (_func_int **)&PTR__CharContent_00117c48;
      __return_storage_ptr__->npos = 0xffffffffffffffff;
      uVar8 = pmVar4->m_length;
      pcVar2 = (char *)operator_new__(uVar8);
LAB_001090ff:
      __return_storage_ptr__->m = pcVar2;
      __return_storage_ptr__->size = pmVar4->size;
      __return_storage_ptr__->m_length = uVar8;
      memset(pcVar2,0,uVar8);
      memmove(pcVar2,pmVar4->m,uVar8);
LAB_00109133:
      local_60._vptr_CharContent = (_func_int **)&PTR__CharContent_00117c48;
      if (local_60.m != (char *)0x0) {
        operator_delete__(local_60.m);
      }
    }
  }
  else {
    bVar1 = operator==(cgi_key,"CONTENT_LENGTH");
    if (bVar1) {
      CharContent::CharContent(&local_88,"Content-Length");
      iVar3 = std::
              _Hashtable<CharContent,_std::pair<const_CharContent,_CharContent>,_std::allocator<std::pair<const_CharContent,_CharContent>_>,_std::__detail::_Select1st,_EqualFunc,_hashFunc,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&(request->headers)._M_h,&local_88);
      if (iVar3.super__Node_iterator_base<std::pair<const_CharContent,_CharContent>,_true>._M_cur !=
          (__node_type *)0x0) {
        CharContent::CharContent(&local_60,"Content-Length");
        pmVar4 = std::__detail::
                 _Map_base<CharContent,_std::pair<const_CharContent,_CharContent>,_std::allocator<std::pair<const_CharContent,_CharContent>_>,_std::__detail::_Select1st,_EqualFunc,_hashFunc,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<CharContent,_std::pair<const_CharContent,_CharContent>,_std::allocator<std::pair<const_CharContent,_CharContent>_>,_std::__detail::_Select1st,_EqualFunc,_hashFunc,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)&request->headers,&local_60);
        __return_storage_ptr__->_vptr_CharContent = (_func_int **)&PTR__CharContent_00117c48;
        __return_storage_ptr__->npos = 0xffffffffffffffff;
        uVar8 = pmVar4->m_length;
        pcVar2 = (char *)operator_new__(uVar8);
        goto LAB_001090ff;
      }
      CharContent::CharContent(__return_storage_ptr__,"");
    }
    else {
      bVar1 = operator==(cgi_key,"QUERY_STRING");
      if (!bVar1) {
        bVar1 = operator==(cgi_key,"SCRIPT_NAME");
        if (bVar1) {
          local_88._vptr_CharContent = (_func_int **)&PTR__CharContent_00117c48;
          local_88.npos._0_5_ = 0xffffffffff;
          local_88.npos._5_3_ = 0xffffff;
          uVar8 = (request->uri).m_length;
          pvVar5 = operator_new__(uVar8);
          local_88.m._0_5_ = SUB85(pvVar5,0);
          local_88.m._5_3_ = (undefined3)((ulong)pvVar5 >> 0x28);
          local_88.size = (request->uri).size;
          local_88.m_length = uVar8;
          memset(pvVar5,0,uVar8);
          memmove(pvVar5,(request->uri).m,uVar8);
          CharContent::CharContent(&local_60,"?");
          sVar6 = CharContent::find(&local_88,&local_60,0);
          sVar7 = CONCAT35(local_88.npos._5_3_,(undefined5)local_88.npos);
          local_60._vptr_CharContent = (_func_int **)&PTR__CharContent_00117c48;
          if (local_60.m != (char *)0x0) {
            operator_delete__(local_60.m);
          }
          __n = local_88.m_length;
          if (sVar6 == sVar7) {
            __return_storage_ptr__->_vptr_CharContent = (_func_int **)&PTR__CharContent_00117c48;
            __return_storage_ptr__->npos = 0xffffffffffffffff;
            pcVar2 = (char *)operator_new__(local_88.m_length);
            __return_storage_ptr__->m = pcVar2;
            __return_storage_ptr__->size = local_88.size;
            __return_storage_ptr__->m_length = __n;
            memset(pcVar2,0,__n);
            pvVar5 = (void *)CONCAT35(local_88.m._5_3_,local_88.m._0_5_);
            memmove(pcVar2,pvVar5,__n);
          }
          else {
            CharContent::subCharContent(__return_storage_ptr__,&local_88,0,sVar6);
            pvVar5 = (void *)CONCAT35(local_88.m._5_3_,local_88.m._0_5_);
          }
          goto joined_r0x001093d9;
        }
        bVar1 = operator==(cgi_key,"PATH_INFO");
        if (bVar1) {
          cc = &this->_name;
LAB_001093b0:
          CharContent::CharContent(__return_storage_ptr__,cc);
          return __return_storage_ptr__;
        }
        bVar1 = operator==(cgi_key,"PATH_TRANSLATED");
        if (bVar1) {
          cc = &this->_path;
          goto LAB_001093b0;
        }
        bVar1 = operator==(cgi_key,"REMOTE_ADDR");
        if ((bVar1) || (bVar1 = operator==(cgi_key,"REMOTE_HOST"), bVar1)) {
          local_34 = 0x10;
          getpeername(this->_connfd,(sockaddr *)&local_60,&local_34);
        }
        else {
          bVar1 = operator==(cgi_key,"GATEWAY_INTERFACE");
          if (bVar1) {
            pcVar2 = "CGI/1.1";
            goto LAB_00109456;
          }
          bVar1 = operator==(cgi_key,"SERVER_NAME");
          if (!bVar1) {
            bVar1 = operator==(cgi_key,"SERVER_PORT");
            if (bVar1) {
              local_2c = 0x10;
              getsockname(this->_connfd,(sockaddr *)&local_60,&local_2c);
              local_88._vptr_CharContent = (_func_int **)0x0;
              local_88.npos._0_5_ = 0;
              local_88.npos._5_3_ = 0;
              local_88.m._0_5_ = 0;
              inet_ntop(2,(void *)((long)&local_60._vptr_CharContent + 4),(char *)&local_88,0x15);
              pcVar2 = (char *)&local_34;
              uStack_30 = 0;
              local_34 = 0;
              snprintf(pcVar2,7,"%d",
                       (ulong)(ushort)(local_60._vptr_CharContent._2_2_ << 8 |
                                      local_60._vptr_CharContent._2_2_ >> 8));
              goto LAB_00109456;
            }
            bVar1 = operator==(cgi_key,"SERVER_PROTOCOL");
            if (bVar1) {
              pcVar2 = "HTTP/1.1";
              goto LAB_00109456;
            }
            bVar1 = operator==(cgi_key,"HTTP_ACCEPT");
            if (bVar1) {
              CharContent::CharContent(&local_88,"Content-Type");
              iVar3 = std::
                      _Hashtable<CharContent,_std::pair<const_CharContent,_CharContent>,_std::allocator<std::pair<const_CharContent,_CharContent>_>,_std::__detail::_Select1st,_EqualFunc,_hashFunc,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      ::find(&(request->headers)._M_h,&local_88);
              if (iVar3.super__Node_iterator_base<std::pair<const_CharContent,_CharContent>,_true>.
                  _M_cur != (__node_type *)0x0) {
                CharContent::CharContent(&local_60,"Content-Type");
                pmVar4 = std::__detail::
                         _Map_base<CharContent,_std::pair<const_CharContent,_CharContent>,_std::allocator<std::pair<const_CharContent,_CharContent>_>,_std::__detail::_Select1st,_EqualFunc,_hashFunc,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         ::operator[]((_Map_base<CharContent,_std::pair<const_CharContent,_CharContent>,_std::allocator<std::pair<const_CharContent,_CharContent>_>,_std::__detail::_Select1st,_EqualFunc,_hashFunc,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                       *)&request->headers,&local_60);
                CharContent::CharContent(__return_storage_ptr__,pmVar4);
                goto LAB_00109133;
              }
              CharContent::CharContent(__return_storage_ptr__,"");
            }
            else {
              bVar1 = operator==(cgi_key,"HTTP_USER_AGENT");
              if (bVar1) {
                CharContent::CharContent(&local_88,"User-Agent");
                iVar3 = std::
                        _Hashtable<CharContent,_std::pair<const_CharContent,_CharContent>,_std::allocator<std::pair<const_CharContent,_CharContent>_>,_std::__detail::_Select1st,_EqualFunc,_hashFunc,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                        ::find(&(request->headers)._M_h,&local_88);
                if (iVar3.super__Node_iterator_base<std::pair<const_CharContent,_CharContent>,_true>
                    ._M_cur != (__node_type *)0x0) {
                  CharContent::CharContent(&local_60,"User-Agent");
                  pmVar4 = std::__detail::
                           _Map_base<CharContent,_std::pair<const_CharContent,_CharContent>,_std::allocator<std::pair<const_CharContent,_CharContent>_>,_std::__detail::_Select1st,_EqualFunc,_hashFunc,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           ::operator[]((_Map_base<CharContent,_std::pair<const_CharContent,_CharContent>,_std::allocator<std::pair<const_CharContent,_CharContent>_>,_std::__detail::_Select1st,_EqualFunc,_hashFunc,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                         *)&request->headers,&local_60);
                  CharContent::CharContent(__return_storage_ptr__,pmVar4);
                  goto LAB_00109133;
                }
                CharContent::CharContent(__return_storage_ptr__,"");
              }
              else {
                bVar1 = operator==(cgi_key,"HTTP_REFERER");
                if (bVar1) {
                  CharContent::CharContent(&local_88,"Referer");
                  iVar3 = std::
                          _Hashtable<CharContent,_std::pair<const_CharContent,_CharContent>,_std::allocator<std::pair<const_CharContent,_CharContent>_>,_std::__detail::_Select1st,_EqualFunc,_hashFunc,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                          ::find(&(request->headers)._M_h,&local_88);
                  if (iVar3.
                      super__Node_iterator_base<std::pair<const_CharContent,_CharContent>,_true>.
                      _M_cur != (__node_type *)0x0) {
                    CharContent::CharContent(&local_60,"Referer");
                    pmVar4 = std::__detail::
                             _Map_base<CharContent,_std::pair<const_CharContent,_CharContent>,_std::allocator<std::pair<const_CharContent,_CharContent>_>,_std::__detail::_Select1st,_EqualFunc,_hashFunc,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             ::operator[]((_Map_base<CharContent,_std::pair<const_CharContent,_CharContent>,_std::allocator<std::pair<const_CharContent,_CharContent>_>,_std::__detail::_Select1st,_EqualFunc,_hashFunc,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                           *)&request->headers,&local_60);
                    CharContent::CharContent(__return_storage_ptr__,pmVar4);
                    goto LAB_00109133;
                  }
                  CharContent::CharContent(__return_storage_ptr__,"");
                }
                else {
                  bVar1 = operator==(cgi_key,"HTTP_COOKIE");
                  if (!bVar1) {
                    pcVar2 = "";
                    goto LAB_00109456;
                  }
                  CharContent::CharContent(&local_88,"Cookie");
                  iVar3 = std::
                          _Hashtable<CharContent,_std::pair<const_CharContent,_CharContent>,_std::allocator<std::pair<const_CharContent,_CharContent>_>,_std::__detail::_Select1st,_EqualFunc,_hashFunc,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                          ::find(&(request->headers)._M_h,&local_88);
                  if (iVar3.
                      super__Node_iterator_base<std::pair<const_CharContent,_CharContent>,_true>.
                      _M_cur != (__node_type *)0x0) {
                    CharContent::CharContent(&local_60,"Cookie");
                    pmVar4 = std::__detail::
                             _Map_base<CharContent,_std::pair<const_CharContent,_CharContent>,_std::allocator<std::pair<const_CharContent,_CharContent>_>,_std::__detail::_Select1st,_EqualFunc,_hashFunc,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             ::operator[]((_Map_base<CharContent,_std::pair<const_CharContent,_CharContent>,_std::allocator<std::pair<const_CharContent,_CharContent>_>,_std::__detail::_Select1st,_EqualFunc,_hashFunc,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                           *)&request->headers,&local_60);
                    CharContent::CharContent(__return_storage_ptr__,pmVar4);
                    goto LAB_00109133;
                  }
                  CharContent::CharContent(__return_storage_ptr__,"");
                }
              }
            }
            goto LAB_0010933a;
          }
          local_34 = 0x10;
          getsockname(this->_connfd,(sockaddr *)&local_60,&local_34);
        }
        local_88._vptr_CharContent = (_func_int **)0x0;
        local_88.npos._0_5_ = 0;
        local_88.npos._5_3_ = 0;
        local_88.m._0_5_ = 0;
        inet_ntop(2,(void *)((long)&local_60._vptr_CharContent + 4),(char *)&local_88,0x15);
LAB_00109456:
        CharContent::CharContent(__return_storage_ptr__,pcVar2);
        return __return_storage_ptr__;
      }
      local_88._vptr_CharContent = (_func_int **)&PTR__CharContent_00117c48;
      local_88.npos._0_5_ = 0xffffffffff;
      local_88.npos._5_3_ = 0xffffff;
      uVar8 = (request->uri).m_length;
      pvVar5 = operator_new__(uVar8);
      local_88.m._0_5_ = SUB85(pvVar5,0);
      local_88.m._5_3_ = (undefined3)((ulong)pvVar5 >> 0x28);
      local_88.size = (request->uri).size;
      local_88.m_length = uVar8;
      memset(pvVar5,0,uVar8);
      memmove(pvVar5,(request->uri).m,uVar8);
      CharContent::CharContent(&local_60,"?");
      sVar6 = CharContent::find(&local_88,&local_60,0);
      sVar7 = CONCAT35(local_88.npos._5_3_,(undefined5)local_88.npos);
      local_60._vptr_CharContent = (_func_int **)&PTR__CharContent_00117c48;
      if (local_60.m != (char *)0x0) {
        operator_delete__(local_60.m);
      }
      if (sVar6 == sVar7) {
        CharContent::CharContent(__return_storage_ptr__,"");
      }
      else {
        sVar7 = CharContent::length(&local_88);
        CharContent::subCharContent(__return_storage_ptr__,&local_88,sVar6 + 1,sVar7 + ~sVar6);
      }
    }
  }
LAB_0010933a:
  pvVar5 = (void *)CONCAT35(local_88.m._5_3_,local_88.m._0_5_);
joined_r0x001093d9:
  if (pvVar5 != (void *)0x0) {
    local_88._vptr_CharContent = (_func_int **)&PTR__CharContent_00117c48;
    operator_delete__(pvVar5);
  }
  return __return_storage_ptr__;
}

Assistant:

CharContent CGI::make_environment(Request request,CharContent cgi_key){
	//to do
	if(cgi_key=="REQUEST_METHOD"){
		return request.method;
	}else if(cgi_key=="CONTENT_TYPE"){
		return request.headers.find("Content-Type")!=request.headers.end()?request.headers["Content-Type"]:"";
	}else if(cgi_key=="CONTENT_LENGTH"){
		return request.headers.find("Content-Length")!=request.headers.end()?request.headers["Content-Length"]:"";
	}else if(cgi_key=="QUERY_STRING"){
		CharContent path=request.uri;
		size_t pos=0;
		if((pos=path.find("?"))==path.npos){
			return "";
		}
		return path.subCharContent(pos+1,path.length()-pos-1);
	}else if(cgi_key=="SCRIPT_NAME"){
		CharContent path=request.uri;
		size_t pos=0;
		if((pos=path.find("?"))==path.npos){
			return path;
		}
		return path.subCharContent(0,pos);
	}else if(cgi_key=="PATH_INFO"){
		return this->_name;
	}else if(cgi_key=="PATH_TRANSLATED"){
		return this->_path;
	}else if(cgi_key=="REMOTE_ADDR"){
		//发送此次请求的主机IP
		sockaddr_in remote_sock;
		socklen_t remote_sock_len=sizeof(remote_sock);
		getpeername(_connfd,(sockaddr *)&remote_sock,&remote_sock_len);
		char client_ip[21]={'\0'};
		inet_ntop(AF_INET, &remote_sock.sin_addr, client_ip, sizeof(client_ip));
		CharContent temp(client_ip);
		return temp;
	}else if(cgi_key=="REMOTE_HOST"){
		//发送此次请求的主机名
		sockaddr_in remote_sock;
		socklen_t remote_sock_len=sizeof(remote_sock);
		getpeername(_connfd,(sockaddr *)&remote_sock,&remote_sock_len);
		char client_ip[21]={'\0'};
		inet_ntop(AF_INET, &remote_sock.sin_addr, client_ip, sizeof(client_ip));
		CharContent temp(client_ip);
		return temp;
	}else if(cgi_key=="GATEWAY_INTERFACE"){
		return CharContent("CGI/1.1");
	}else if(cgi_key=="SERVER_NAME"){
		//服务器主机名、域名或IP
		sockaddr_in local_sock;
		socklen_t local_sock_len=sizeof(local_sock);
		getsockname(_connfd,(sockaddr *)&local_sock,&local_sock_len);
		char server_ip[21]={'\0'};
		inet_ntop(AF_INET, &local_sock.sin_addr, server_ip, sizeof(server_ip));
		CharContent temp(server_ip);
		return temp;
	}else if(cgi_key=="SERVER_PORT"){
		//服务器端口号
		sockaddr_in local_sock;
		socklen_t local_sock_len=sizeof(local_sock);
		getsockname(_connfd,(sockaddr *)&local_sock,&local_sock_len);
		char server_ip[21]={'\0'};
		inet_ntop(AF_INET, &local_sock.sin_addr, server_ip, sizeof(server_ip));
		char server_port[7]={'\0'};
		snprintf(server_port,sizeof(server_port),"%d",ntohs(local_sock.sin_port));
		CharContent temp(server_port);
		return temp;
	}else if(cgi_key=="SERVER_PROTOCOL"){
		return CharContent("HTTP/1.1");
	}else if(cgi_key=="HTTP_ACCEPT"){
		return request.headers.find("Content-Type")!=request.headers.end()?request.headers["Content-Type"]:"";
	}else if(cgi_key=="HTTP_USER_AGENT"){
		return request.headers.find("User-Agent")!=request.headers.end()?request.headers["User-Agent"]:"";
	}else if(cgi_key=="HTTP_REFERER"){
		return request.headers.find("Referer")!=request.headers.end()?request.headers["Referer"]:"";
	}else if(cgi_key=="HTTP_COOKIE"){
		return request.headers.find("Cookie")!=request.headers.end()?request.headers["Cookie"]:"";
	}
	return CharContent("");
}